

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O3

_Bool plutovg_parse_number(char **begin,char *end,float *number)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  char *pcVar4;
  byte *pbVar5;
  byte bVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pbVar2 = (byte *)*begin;
  fVar8 = 1.0;
  if (pbVar2 < end) {
    if (*pbVar2 == 0x2d) {
      pbVar2 = pbVar2 + 1;
      fVar8 = -1.0;
    }
    else if (*pbVar2 == 0x2b) {
      pbVar2 = pbVar2 + 1;
    }
  }
  if (pbVar2 < end) {
    bVar6 = *pbVar2;
    fVar11 = 0.0;
    if (bVar6 == 0x2e) {
      fVar10 = 0.0;
      pbVar5 = pbVar2;
    }
    else {
      if (9 < (byte)(bVar6 - 0x30)) goto LAB_0010f5e5;
      pcVar4 = end + ~(ulong)pbVar2;
      fVar10 = 0.0;
      do {
        fVar10 = fVar10 * 10.0 + (float)(int)(bVar6 - 0x30);
        pbVar5 = (byte *)end;
        if (pcVar4 == (char *)0x0) break;
        bVar6 = pbVar2[1];
        pbVar5 = pbVar2 + 1;
        pcVar4 = pcVar4 + -1;
        pbVar2 = pbVar5;
      } while ((byte)(bVar6 - 0x30) < 10);
    }
    if ((pbVar5 < end) && (*pbVar5 == 0x2e)) {
      pbVar2 = pbVar5 + 1;
      if ((end <= pbVar2) || (bVar6 = *pbVar2, 9 < (byte)(bVar6 - 0x30))) goto LAB_0010f5e5;
      pbVar3 = pbVar5 + ((long)end - (long)pbVar5);
      lVar7 = ((long)end - (long)pbVar5) + -2;
      fVar9 = 1.0;
      fVar11 = 0.0;
      do {
        fVar11 = fVar11 * 10.0 + (float)(int)(bVar6 - 0x30);
        fVar9 = fVar9 * 10.0;
        pbVar5 = pbVar3;
        if (lVar7 == 0) break;
        bVar6 = pbVar2[1];
        pbVar5 = pbVar2 + 1;
        lVar7 = lVar7 + -1;
        pbVar2 = pbVar5;
      } while ((byte)(bVar6 - 0x30) < 10);
      fVar11 = fVar11 / fVar9;
    }
    if ((pbVar5 < end) && ((*pbVar5 | 0x20) == 0x65)) {
      pbVar2 = pbVar5 + 1;
      fVar9 = 1.0;
      pbVar3 = pbVar2;
      if (pbVar2 < end) {
        bVar6 = *pbVar2;
        pbVar3 = pbVar5 + 2;
        if (bVar6 != 0x2b) {
          if (bVar6 == 0x2d) {
            pbVar2 = pbVar3;
          }
          fVar9 = *(float *)(&DAT_001281e0 + (ulong)(bVar6 == 0x2d) * 4);
          pbVar3 = pbVar2;
        }
      }
      if ((end <= pbVar3) || (bVar6 = *pbVar3, 9 < (byte)(bVar6 - 0x30))) goto LAB_0010f5e5;
      pcVar4 = end + ~(ulong)pbVar3;
      fVar12 = 0.0;
      do {
        fVar12 = fVar12 * 10.0 + (float)(int)(bVar6 - 0x30);
        pbVar2 = (byte *)end;
        if (pcVar4 == (char *)0x0) break;
        bVar6 = pbVar3[1];
        pbVar2 = pbVar3 + 1;
        pcVar4 = pcVar4 + -1;
        pbVar3 = pbVar2;
      } while ((byte)(bVar6 - 0x30) < 10);
      *begin = (char *)pbVar2;
      fVar8 = fVar8 * (fVar10 + fVar11);
      *number = fVar8;
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        fVar8 = powf(10.0,fVar9 * fVar12);
        fVar8 = fVar8 * *number;
        goto LAB_0010f55e;
      }
    }
    else {
      *begin = (char *)pbVar5;
      fVar8 = fVar8 * (fVar10 + fVar11);
LAB_0010f55e:
      *number = fVar8;
    }
    bVar1 = ABS(fVar8) <= 3.4028235e+38;
  }
  else {
LAB_0010f5e5:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static inline bool plutovg_parse_number(const char** begin, const char* end, float* number)
{
    const char* it = *begin;
    float integer = 0;
    float fraction = 0;
    float exponent = 0;
    int sign = 1;
    int expsign = 1;

    if(it < end && *it == '+') {
        ++it;
    } else if(it < end && *it == '-') {
        ++it;
        sign = -1;
    }

    if(it >= end || (*it != '.' && !PLUTOVG_IS_NUM(*it)))
        return false;
    if(PLUTOVG_IS_NUM(*it)) {
        do {
            integer = 10.f * integer + (*it++ - '0');
        } while(it < end && PLUTOVG_IS_NUM(*it));
    }

    if(it < end && *it == '.') {
        ++it;
        if(it >= end || !PLUTOVG_IS_NUM(*it))
            return false;
        float divisor = 1.f;
        do {
            fraction = 10.f * fraction + (*it++ - '0');
            divisor *= 10.f;
        } while(it < end && PLUTOVG_IS_NUM(*it));
        fraction /= divisor;
    }

    if(it < end && (*it == 'e' || *it == 'E')) {
        ++it;
        if(it < end && *it == '+') {
            ++it;
        } else if(it < end && *it == '-') {
            ++it;
            expsign = -1;
        }

        if(it >= end || !PLUTOVG_IS_NUM(*it))
            return false;
        do {
            exponent = 10 * exponent + (*it++ - '0');
        } while(it < end && PLUTOVG_IS_NUM(*it));
    }

    *begin = it;
    *number = sign * (integer + fraction);
    if(exponent)
        *number *= powf(10.f, expsign * exponent);
    return *number >= -FLT_MAX && *number <= FLT_MAX;
}